

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txout_txoutreference.cpp
# Opt level: O0

void __thiscall
TxOutReference_GetSerializeSize_Test::TestBody(TxOutReference_GetSerializeSize_Test *this)

{
  bool bVar1;
  char *message;
  Amount AVar2;
  AssertHelper local_110;
  Message local_108;
  int local_100;
  uint32_t local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  undefined1 local_d8 [8];
  TxOutReference txout_ref;
  Amount local_78;
  undefined1 local_68 [8];
  TxOut txout;
  int64_t satoshi;
  TxOutReference_GetSerializeSize_Test *this_local;
  
  txout.super_AbstractTxOut.locking_script_.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xf4240;
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(1000000);
  txout_ref.super_AbstractTxOutReference.locking_script_.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)AVar2.amount_;
  local_78.ignore_check_ = AVar2.ignore_check_;
  local_78.amount_ =
       (int64_t)txout_ref.super_AbstractTxOutReference.locking_script_.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cfd::core::TxOut::TxOut((TxOut *)local_68,&local_78,&exp_script);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)local_d8,(TxOut *)local_68);
  local_fc = cfd::core::AbstractTxOutReference::GetSerializeSize((AbstractTxOutReference *)local_d8)
  ;
  local_100 = 0x22;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_f8,"txout_ref.GetSerializeSize()","34",&local_fc,&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txout_txoutreference.cpp"
               ,0x42,message);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)local_d8);
  cfd::core::TxOut::~TxOut((TxOut *)local_68);
  return;
}

Assistant:

TEST(TxOutReference, GetSerializeSize) {
  {
    int64_t satoshi = 1000000;
    TxOut txout(Amount::CreateBySatoshiAmount(satoshi), exp_script);
    TxOutReference txout_ref(txout);

    EXPECT_EQ(txout_ref.GetSerializeSize(), 34);
  }
}